

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qboxlayout.cpp
# Opt level: O2

void __thiscall QBoxLayout::insertSpacing(QBoxLayout *this,int index,int size)

{
  QBoxLayoutPrivate *this_00;
  bool bVar1;
  int iVar2;
  QSpacerItem *pQVar3;
  parameter_type t;
  int w;
  
  this_00 = *(QBoxLayoutPrivate **)&(this->super_QLayout).field_0x8;
  iVar2 = QBoxLayoutPrivate::validateIndex(this_00,index);
  bVar1 = RightToLeft < this_00->dir;
  if (bVar1) {
    w = 0;
  }
  else {
    w = size;
    size = 0;
  }
  pQVar3 = QLayoutPrivate::createSpacerItem(&this->super_QLayout,w,size,(uint)bVar1,(uint)!bVar1);
  t = (parameter_type)operator_new(0x10);
  t->item = &pQVar3->super_QLayoutItem;
  t->stretch = 0;
  t->magic = true;
  QList<QBoxLayoutItem_*>::insert(&this_00->list,(long)iVar2,t);
  (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
  return;
}

Assistant:

void QBoxLayout::insertSpacing(int index, int size)
{
    Q_D(QBoxLayout);
    index = d->validateIndex(index);
    QLayoutItem *b;
    if (horz(d->dir))
        b = QLayoutPrivate::createSpacerItem(this, size, 0, QSizePolicy::Fixed, QSizePolicy::Minimum);
    else
        b = QLayoutPrivate::createSpacerItem(this, 0, size, QSizePolicy::Minimum, QSizePolicy::Fixed);

    QBoxLayoutItem *it = new QBoxLayoutItem(b);
    it->magic = true;
    d->list.insert(index, it);
    invalidate();
}